

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

int NGA_Locate(int g_a,int *subscript)

{
  Integer IVar1;
  Integer *pIVar2;
  logical lVar3;
  long lVar4;
  long lVar5;
  Integer owner;
  Integer _ga_lo [7];
  
  IVar1 = pnga_ndim((long)g_a);
  lVar4 = 0;
  lVar5 = 0;
  if (0 < IVar1) {
    lVar5 = IVar1;
  }
  pIVar2 = _ga_lo + IVar1 + -1;
  for (; lVar5 != lVar4; lVar4 = lVar4 + 1) {
    *pIVar2 = (long)subscript[lVar4] + 1;
    pIVar2 = pIVar2 + -1;
  }
  lVar3 = pnga_locate((long)g_a,_ga_lo,&owner);
  if (lVar3 != 1) {
    owner._0_4_ = -1;
  }
  return (int)owner;
}

Assistant:

int NGA_Locate(int g_a, int subscript[])
{
    logical st;
    Integer a=(Integer)g_a, owner;
    Integer ndim = wnga_ndim(a);
    Integer _ga_lo[MAXDIM];
    COPYINDEX_C2F(subscript,_ga_lo,ndim);

    st = wnga_locate(a,_ga_lo,&owner);
    if(st == TRUE) return (int)owner;
    else return -1;
}